

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O3

void __thiscall A::A(A *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  spin_mutex_t sVar3;
  float *pfVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  this->n_ = n;
  uVar9 = (ulong)(uint)(n * n) << 2;
  pfVar4 = (float *)operator_new__(uVar9);
  this->a = pfVar4;
  pfVar4 = (float *)operator_new__(uVar9);
  this->b = pfVar4;
  pfVar4 = (float *)operator_new__(uVar9);
  this->c = pfVar4;
  do {
    sVar3.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar3.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Building A of sz=",0x11)
  ;
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,this->n_);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  if (0 < this->n_) {
    pfVar4 = this->c;
    lVar6 = 0;
    uVar9 = 0;
    do {
      if (0 < this->n_) {
        pfVar1 = this->a;
        pfVar2 = this->b;
        uVar7 = uVar9 & 0xffffffff;
        lVar8 = 0;
        do {
          pfVar4[lVar8] = 0.0;
          *(float *)((long)pfVar1 + lVar8 * 4 + lVar6) = (float)((int)uVar9 + (int)lVar8);
          *(float *)((long)pfVar2 + lVar8 * 4 + lVar6) = (float)(int)uVar7;
          lVar8 = lVar8 + 1;
          uVar7 = (ulong)((int)uVar7 - 1);
        } while (lVar8 < this->n_);
      }
      uVar9 = uVar9 + 1;
      pfVar4 = pfVar4 + n;
      lVar6 = lVar6 + (long)n * 4;
    } while ((long)uVar9 < (long)this->n_);
  }
  return;
}

Assistant:

A(int n)
  : n_(n), a(new float[n *n ]), b(new float[n *n ]), c(new float[n *n ])
  {
    LOG("Building A of sz=" << n_);
    
    for(int i = 0; i < n_; i++)
      for(int j = 0; j < n_; j++) {
        c[i*n+j] = 0;
        a[i*n+j] = i + j;
        b[i*n+j] = i - j;
      }
    
  }